

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O0

void __thiscall zmq::session_base_t::timer_event(session_base_t *this,int id_)

{
  int in_ESI;
  long in_RDI;
  bool in_stack_0000002f;
  pipe_t *in_stack_00000030;
  
  if (in_ESI != 0x20) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","id_ == linger_timer_id",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
            ,0x225);
    fflush(_stderr);
    zmq_abort((char *)0x304f3d);
  }
  *(undefined1 *)(in_RDI + 0x5e8) = 0;
  if (*(long *)(in_RDI + 0x588) == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_pipe",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
            ,0x229);
    fflush(_stderr);
    zmq_abort((char *)0x304fa8);
  }
  pipe_t::terminate(in_stack_00000030,in_stack_0000002f);
  return;
}

Assistant:

void zmq::session_base_t::timer_event (int id_)
{
    //  Linger period expired. We can proceed with termination even though
    //  there are still pending messages to be sent.
    zmq_assert (id_ == linger_timer_id);
    _has_linger_timer = false;

    //  Ask pipe to terminate even though there may be pending messages in it.
    zmq_assert (_pipe);
    _pipe->terminate (false);
}